

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::flags_internal::FlagImpl::ParseFrom
          (FlagImpl *this,string_view value,FlagSettingMode set_mode,ValueSource source,string *err)

{
  bool bVar1;
  FlagDefaultKind FVar2;
  Mutex *mu;
  pointer pvVar3;
  pointer pvVar4;
  string *err_00;
  char *pcVar5;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  void *old_value;
  undefined1 local_a8 [8];
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> tentative_value_2;
  undefined1 local_88 [8];
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> tentative_value_1;
  undefined1 local_50 [8];
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> tentative_value;
  MutexLock l;
  string *err_local;
  ValueSource source_local;
  FlagSettingMode set_mode_local;
  FlagImpl *this_local;
  string_view value_local;
  
  err_00 = (string *)value._M_str;
  pcVar5 = (char *)value._M_len;
  mu = DataGuard(this);
  MutexLock::MutexLock
            ((MutexLock *)
             &tentative_value._M_t.
              super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
              super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
              super__Head_base<0UL,_void_*,_false>,mu);
  if (set_mode == SET_FLAGS_VALUE) {
    value_00._M_str = pcVar5;
    value_00._M_len = (size_t)this;
    TryParse((FlagImpl *)local_50,value_00,err_00);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_50);
    if (bVar1) {
      pvVar4 = std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::get
                         ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
                          local_50);
      StoreValue(this,pvVar4,source);
      if (source == kCommandLine) {
        this->field_0x29 = this->field_0x29 & 0xf7 | 8;
      }
      tentative_value_1._M_t.
      super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
      super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 2;
    }
    else {
      value_local._M_str._7_1_ = 0;
      tentative_value_1._M_t.
      super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
      super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 1;
    }
    std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
              ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)local_50);
joined_r0x0010fb2b:
    if ((int)tentative_value_1._M_t.
             super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
             super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
             super__Head_base<0UL,_void_*,_false>._M_head_impl != 2) goto LAB_0010fd53;
  }
  else {
    if (set_mode == SET_FLAG_IF_DEFAULT) {
      if (((byte)this->field_0x29 >> 2 & 1) != 0) {
        value_local._M_str._7_1_ = 1;
        tentative_value_1._M_t.
        super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
        super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 1;
        goto LAB_0010fd53;
      }
      value_01._M_str = pcVar5;
      value_01._M_len = (size_t)this;
      tentative_value_2._M_t.
      super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
      super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl = pcVar5;
      TryParse((FlagImpl *)local_88,value_01,err_00);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_88);
      if (bVar1) {
        pvVar4 = std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::get
                           ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *
                            )local_88);
        StoreValue(this,pvVar4,source);
        tentative_value_1._M_t.
        super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
        super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 2;
      }
      else {
        value_local._M_str._7_1_ = 0;
        tentative_value_1._M_t.
        super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
        super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 1;
      }
      std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
                ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)local_88);
      goto joined_r0x0010fb2b;
    }
    if (set_mode == SET_FLAGS_DEFAULT) {
      value_02._M_str = pcVar5;
      value_02._M_len = (size_t)this;
      TryParse((FlagImpl *)local_a8,value_02,err_00);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_a8);
      if (bVar1) {
        FVar2 = DefaultKind(this);
        if (FVar2 == kDynamicValue) {
          pvVar4 = (this->default_value_).dynamic_value;
          pvVar3 = std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::
                   release((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
                           local_a8);
          (this->default_value_).dynamic_value = pvVar3;
          std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::reset
                    ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
                     local_a8,pvVar4);
        }
        else {
          pvVar4 = std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::
                   release((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
                           local_a8);
          (this->default_value_).dynamic_value = pvVar4;
          this->field_0x29 = this->field_0x29 & 0xfc;
        }
        if (((byte)this->field_0x29 >> 2 & 1) == 0) {
          StoreValue(this,(this->default_value_).dynamic_value,source);
          this->field_0x29 = this->field_0x29 & 0xfb;
        }
        tentative_value_1._M_t.
        super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
        super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 2;
      }
      else {
        value_local._M_str._7_1_ = 0;
        tentative_value_1._M_t.
        super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
        super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 1;
      }
      std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
                ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)local_a8);
      goto joined_r0x0010fb2b;
    }
  }
  value_local._M_str._7_1_ = 1;
  tentative_value_1._M_t.
  super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
  super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl._0_4_ = 1;
LAB_0010fd53:
  MutexLock::~MutexLock
            ((MutexLock *)
             &tentative_value._M_t.
              super___uniq_ptr_impl<void,_absl::lts_20240722::flags_internal::DynValueDeleter>._M_t.
              super__Tuple_impl<0UL,_void_*,_absl::lts_20240722::flags_internal::DynValueDeleter>.
              super__Head_base<0UL,_void_*,_false>);
  return (bool)(value_local._M_str._7_1_ & 1);
}

Assistant:

bool FlagImpl::ParseFrom(absl::string_view value, FlagSettingMode set_mode,
                         ValueSource source, std::string& err) {
  absl::MutexLock l(DataGuard());

  switch (set_mode) {
    case SET_FLAGS_VALUE: {
      // set or modify the flag's value
      auto tentative_value = TryParse(value, err);
      if (!tentative_value) return false;

      StoreValue(tentative_value.get(), source);

      if (source == kCommandLine) {
        on_command_line_ = true;
      }
      break;
    }
    case SET_FLAG_IF_DEFAULT: {
      // set the flag's value, but only if it hasn't been set by someone else
      if (modified_) {
        // TODO(rogeeff): review and fix this semantic. Currently we do not fail
        // in this case if flag is modified. This is misleading since the flag's
        // value is not updated even though we return true.
        // *err = absl::StrCat(Name(), " is already set to ",
        //                     CurrentValue(), "\n");
        // return false;
        return true;
      }
      auto tentative_value = TryParse(value, err);
      if (!tentative_value) return false;

      StoreValue(tentative_value.get(), source);
      break;
    }
    case SET_FLAGS_DEFAULT: {
      auto tentative_value = TryParse(value, err);
      if (!tentative_value) return false;

      if (DefaultKind() == FlagDefaultKind::kDynamicValue) {
        void* old_value = default_value_.dynamic_value;
        default_value_.dynamic_value = tentative_value.release();
        tentative_value.reset(old_value);
      } else {
        default_value_.dynamic_value = tentative_value.release();
        def_kind_ = static_cast<uint8_t>(FlagDefaultKind::kDynamicValue);
      }

      if (!modified_) {
        // Need to set both default value *and* current, in this case.
        StoreValue(default_value_.dynamic_value, source);
        modified_ = false;
      }
      break;
    }
  }

  return true;
}